

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gvar2.c
# Opt level: O3

LispPTR N_OP_gvar_(LispPTR tos,uint atom_index)

{
  uint ptr;
  uint *puVar1;
  
  if ((atom_index & 0xfff0000) == 0) {
    puVar1 = (uint *)(AtomSpace + (ulong)(atom_index * 5) * 2 + 2);
  }
  else {
    if ((atom_index & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
    }
    puVar1 = (uint *)(Lisp_world + (atom_index + 2));
  }
  if ((-1 < *(short *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(tos,0);
    }
    else {
      htfind(tos,0);
    }
  }
  if ((-1 < *(short *)((ulong)(*puVar1 >> 8 & 0xffffe) + (long)MDStypetbl ^ 2)) &&
     (*GcDisabled_word != 0x4c)) {
    ptr = *puVar1 & 0xfffffff;
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(ptr,1);
    }
    else {
      htfind(ptr,1);
    }
  }
  *puVar1 = *puVar1 & 0xf0000000 | tos & 0xfffffff;
  return tos;
}

Assistant:

LispPTR N_OP_gvar_(LispPTR tos, unsigned int atom_index) {
  LispPTR *pslot; /* Native pointer to GVAR slot of atom */

#ifdef BIGATOMS
  if (0 != (atom_index & SEGMASK))
    pslot = (LispPTR *)NativeAligned4FromLAddr(atom_index + NEWATOM_VALUE_OFFSET);
  else
#endif /* BIGATOMS */

#ifdef BIGVM
    pslot = ((LispPTR *)AtomSpace) + (5 * atom_index) + NEWATOM_VALUE_PTROFF;
#else
    pslot = (LispPTR *)Valspace + atom_index;
#endif /* BIGVM */
  DEBUGGER(if (tos & 0xF0000000) error("Setting GVAR with high bits on"));
  FRPLPTR(((struct xpointer *)pslot)->addr, tos);
  return (tos);
}